

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JtagAnalyzer.cpp
# Opt level: O2

void __thiscall
JtagAnalyzer::AdvanceTck(JtagAnalyzer *this,Frame *frm,JtagShiftedData *shifted_data)

{
  AnalyzerChannelData *pAVar1;
  char cVar2;
  U64 ending_sample_number;
  long lVar3;
  
  pAVar1 = this->mTrst;
  if (pAVar1 != (AnalyzerChannelData *)0x0) {
    AnalyzerChannelData::GetSampleOfNextEdge();
    cVar2 = AnalyzerChannelData::WouldAdvancingToAbsPositionCauseTransition((ulonglong)pAVar1);
    if (cVar2 != '\0') {
      AnalyzerChannelData::AdvanceToNextEdge();
      ending_sample_number = AnalyzerChannelData::GetSampleNumber();
      CloseFrameV2(this,frm,shifted_data,ending_sample_number);
      (this->mTAPCtrl).mCurrTAPState = TestLogicReset;
      lVar3 = AnalyzerChannelData::GetSampleNumber();
      *(long *)frm = lVar3 + 1;
      frm[0x20] = *(Frame *)&(this->mTAPCtrl).mCurrTAPState;
      AnalyzerChannelData::AdvanceToNextEdge();
      pAVar1 = this->mTck;
      AnalyzerChannelData::GetSampleNumber();
      AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)pAVar1);
      return;
    }
  }
  AnalyzerChannelData::AdvanceToNextEdge();
  return;
}

Assistant:

void JtagAnalyzer::AdvanceTck( Frame& frm, JtagShiftedData& shifted_data )
{
    if( mTrst != NULL && mTrst->WouldAdvancingToAbsPositionCauseTransition( mTck->GetSampleOfNextEdge() ) )
    {
        mTrst->AdvanceToNextEdge();

        // close the frame and add it
        CloseFrameV2( frm, shifted_data, mTrst->GetSampleNumber() );

        // reset the TAP state
        mTAPCtrl.SetState( TestLogicReset );

        // prepare the reset frame
        frm.mStartingSampleInclusive = mTrst->GetSampleNumber() + 1;
        frm.mType = mTAPCtrl.GetCurrState();

        // find the rising edge of TRST
        mTrst->AdvanceToNextEdge();

        // bring TCK here too
        mTck->AdvanceToAbsPosition( mTrst->GetSampleNumber() );
    }
    else
    {
        mTck->AdvanceToNextEdge();
    }
}